

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.cpp
# Opt level: O2

void __thiscall RayTracerTriangles::processPixels(RayTracerTriangles *this)

{
  int threadId;
  int i;
  long lVar1;
  code *local_78;
  undefined8 local_70;
  undefined1 auStack_68 [8];
  vector<std::thread,_std::allocator<std::thread>_> thVec;
  thread local_48;
  RayTracerTriangles *local_40;
  int local_34;
  
  thVec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  thVec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_34 = 0;
  while( true ) {
    threadId = this->threadNumber + -1;
    if (threadId <= local_34) break;
    local_78 = processPixelsThreads;
    local_70 = 0;
    local_40 = this;
    std::thread::thread<void(RayTracerTriangles::*)(int),RayTracerTriangles*,int&,void>
              (&local_48,(type *)&local_78,&local_40,&local_34);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_68,&local_48);
    std::thread::~thread(&local_48);
    local_34 = local_34 + 1;
  }
  processPixelsThreads(this,threadId);
  for (lVar1 = 0; lVar1 < (long)this->threadNumber + -1; lVar1 = lVar1 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_68);
  return;
}

Assistant:

void RayTracerTriangles::processPixels()
{
  std::vector<std::thread> thVec;
  for (int i = 0; i < threadNumber - 1; i++)
    thVec.push_back(std::thread(&RayTracerTriangles::processPixelsThreads, this, i));

  processPixelsThreads(threadNumber - 1);

  for (int i = 0; i < threadNumber - 1; i++)
    thVec[i].join();
}